

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_ep_fini(void *arg)

{
  tlstran_ep *ep;
  void *arg_local;
  
  nng_stream_dialer_free(*(nng_stream_dialer **)((long)arg + 0x58));
  nng_stream_listener_free(*(nng_stream_listener **)((long)arg + 0x60));
  nni_aio_fini((nni_aio *)((long)arg + 0x248));
  nni_aio_fini((nni_aio *)((long)arg + 0x80));
  nni_mtx_fini((nni_mtx *)arg);
  return;
}

Assistant:

static void
tlstran_ep_fini(void *arg)
{
	tlstran_ep *ep = arg;

	nng_stream_dialer_free(ep->dialer);
	nng_stream_listener_free(ep->listener);
	nni_aio_fini(&ep->timeaio);
	nni_aio_fini(&ep->connaio);

	nni_mtx_fini(&ep->mtx);
}